

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::BlendShape::BlendShape
          (BlendShape *this,uint64_t id,Element *element,Document *doc,string *name)

{
  pointer *pppBVar1;
  iterator __position;
  pointer ppCVar2;
  BlendShapeChannel *bspc;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_50
  ;
  BlendShapeChannel *local_38;
  
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShape_0025d078;
  (this->blendShapeChannels).
  super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blendShapeChannels).
  super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blendShapeChannels).
  super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Document::GetConnectionsByDestinationSequenced
            (&local_50,doc,(this->super_Deformer).super_Object.id,"Deformer");
  std::
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ::reserve(&this->blendShapeChannels,
            (long)local_50.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_50.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  for (ppCVar2 = local_50.
                 super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 !=
      local_50.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
    local_38 = Util::ProcessSimpleConnection<Assimp::FBX::BlendShapeChannel>
                         (*ppCVar2,false,"BlendShapeChannel -> BlendShape",element,(char **)0x0);
    if (local_38 != (BlendShapeChannel *)0x0) {
      __position._M_current =
           (this->blendShapeChannels).
           super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->blendShapeChannels).
          super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>
        ::_M_realloc_insert<Assimp::FBX::BlendShapeChannel_const*const&>
                  ((vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>
                    *)&this->blendShapeChannels,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppBVar1 = &(this->blendShapeChannels).
                    super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
    }
  }
  if (local_50.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BlendShape::BlendShape(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Deformer(id, element, doc, name)
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(), "Deformer");
    blendShapeChannels.reserve(conns.size());
    for (const Connection* con : conns) {
        const BlendShapeChannel* const bspc = ProcessSimpleConnection<BlendShapeChannel>(*con, false, "BlendShapeChannel -> BlendShape", element);
        if (bspc) {
            blendShapeChannels.push_back(bspc);
            continue;
        }
    }
}